

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.cxx
# Opt level: O3

void __thiscall Fl_Window::~Fl_Window(Fl_Window *this)

{
  Fl_Bitmap *pFVar1;
  
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Window_00279fe0;
  hide(this);
  if (this->xclass_ != (char *)0x0) {
    free(this->xclass_);
  }
  free_icons(this);
  operator_delete(this->icon_,0x18);
  if (shape_data_ != (shape_data_type *)0x0) {
    pFVar1 = shape_data_->todelete_;
    if (pFVar1 != (Fl_Bitmap *)0x0) {
      (*(pFVar1->super_Fl_Image)._vptr_Fl_Image[1])(pFVar1);
    }
    operator_delete(shape_data_,0x18);
  }
  Fl_Group::~Fl_Group(&this->super_Fl_Group);
  return;
}

Assistant:

Fl_Window::~Fl_Window() {
  hide();
  if (xclass_) {
    free(xclass_);
  }
  free_icons();
  delete icon_;
  if (shape_data_) {
    if (shape_data_->todelete_) delete shape_data_->todelete_;
#if defined(__APPLE__)
    if (shape_data_->mask) {
      CGImageRelease(shape_data_->mask);
    }
#endif
    delete shape_data_;
  }
}